

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkAig.c
# Opt level: O2

Vec_Ptr_t * Nwk_ManDeriveRetimingCut(Aig_Man_t *p,int fForward,int fVerbose)

{
  Nwk_Man_t *pMan;
  Vec_Ptr_t *p_00;
  void *pvVar1;
  ulong uVar2;
  int i;
  long lVar3;
  
  pMan = Nwk_ManDeriveFromAig(p);
  if (fForward == 0) {
    p_00 = Nwk_ManRetimeCutBackward(pMan,p->nRegs,fVerbose);
  }
  else {
    p_00 = Nwk_ManRetimeCutForward(pMan,p->nRegs,fVerbose);
  }
  for (i = 0; i < p->vObjs->nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(p->vObjs,i);
    if (pvVar1 != (void *)0x0) {
      *(void **)(*(long *)((long)pvVar1 + 0x28) + 0x10) = pvVar1;
    }
  }
  uVar2 = (ulong)(uint)p_00->nSize;
  lVar3 = 0;
  while( true ) {
    if ((int)uVar2 <= lVar3) {
      Nwk_ManFree(pMan);
      return p_00;
    }
    pvVar1 = Vec_PtrEntry(p_00,(int)lVar3);
    uVar2 = (ulong)p_00->nSize;
    if ((long)uVar2 <= lVar3) break;
    p_00->pArray[lVar3] = *(void **)((long)pvVar1 + 0x10);
    lVar3 = lVar3 + 1;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
}

Assistant:

Vec_Ptr_t * Nwk_ManDeriveRetimingCut( Aig_Man_t * p, int fForward, int fVerbose )
{ 
    Vec_Ptr_t * vNodes;
    Nwk_Man_t * pNtk;
    Nwk_Obj_t * pNode;
    Aig_Obj_t * pObj;
    int i;
    pNtk = Nwk_ManDeriveFromAig( p );
    if ( fForward )
        vNodes = Nwk_ManRetimeCutForward( pNtk, Aig_ManRegNum(p), fVerbose );
    else
        vNodes = Nwk_ManRetimeCutBackward( pNtk, Aig_ManRegNum(p), fVerbose );
    Aig_ManForEachObj( p, pObj, i )
        ((Nwk_Obj_t *)pObj->pData)->pCopy = pObj;
    Vec_PtrForEachEntry( Nwk_Obj_t *, vNodes, pNode, i )
        Vec_PtrWriteEntry( vNodes, i, pNode->pCopy );
    Nwk_ManFree( pNtk );
//    assert( Vec_PtrSize(vNodes) <= Aig_ManRegNum(p) );
    return vNodes;
}